

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateGLImpl.cpp
# Opt level: O1

void __thiscall
Diligent::PipelineStateGLImpl::PipelineStateGLImpl
          (PipelineStateGLImpl *this,IReferenceCounters *pRefCounters,RenderDeviceGLImpl *pDeviceGL,
          GraphicsPipelineStateCreateInfo *CreateInfo,bool bIsDeviceInternal)

{
  PipelineBuilderBase *pPVar1;
  RefCntAutoPtr<Diligent::ShaderGLImpl> RVar2;
  RefCntAutoPtr<Diligent::ShaderGLImpl> *pRVar3;
  PIPELINE_STATE_STATUS PVar4;
  PipelineBuilder<Diligent::GraphicsPipelineStateCreateInfo,_Diligent::GraphicsPipelineStateCreateInfoX>
  *this_00;
  TShaderStages *Shaders_00;
  RefCntAutoPtr<Diligent::ShaderGLImpl> pTempPS;
  TShaderStages Shaders;
  ShaderCreateInfo ShaderCI;
  RefCntAutoPtr<Diligent::ShaderGLImpl> local_100;
  vector<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_> local_f8;
  RefCntAutoPtr<Diligent::ShaderGLImpl> local_d8;
  RefCntAutoPtr<Diligent::ShaderGLImpl> *local_d0;
  undefined1 local_c8 [32];
  anon_union_8_2_8aa5a88c_for_ShaderCreateInfo_4 local_a8;
  char *local_a0;
  ShaderMacro *local_98;
  Uint32 local_90;
  char *local_88;
  SHADER_TYPE local_80;
  Bool local_7c;
  char *local_78;
  undefined8 local_70;
  ShaderVersion SStack_68;
  ShaderVersion local_60;
  ShaderVersion SStack_58;
  undefined1 auStack_50 [16];
  char *local_40;
  char *pcStack_38;
  
  PipelineStateBase<Diligent::EngineGLImplTraits>::
  PipelineStateBase<Diligent::GraphicsPipelineStateCreateInfo>
            (&this->super_PipelineStateBase<Diligent::EngineGLImplTraits>,pRefCounters,pDeviceGL,
             CreateInfo,bIsDeviceInternal);
  (this->super_PipelineStateBase<Diligent::EngineGLImplTraits>).
  super_DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
  .super_ObjectBase<Diligent::IPipelineStateGL>.super_RefCountedObject<Diligent::IPipelineStateGL>.
  super_IPipelineStateGL.super_IPipelineState.super_IDeviceObject =
       (IDeviceObject)&PTR_QueryInterface_00b04730;
  this->m_GLPrograms = (SharedGLProgramPtr *)0x0;
  (this->m_ProgPipelineLock).m_IsLocked._M_base._M_i = false;
  (this->m_GLProgPipelines).
  super__Vector_base<std::pair<__GLXcontextRec_*,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>_>,_std::allocator<std::pair<__GLXcontextRec_*,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_GLProgPipelines).
  super__Vector_base<std::pair<__GLXcontextRec_*,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>_>,_std::allocator<std::pair<__GLXcontextRec_*,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->m_GLProgPipelines).
           super__Vector_base<std::pair<__GLXcontextRec_*,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>_>,_std::allocator<std::pair<__GLXcontextRec_*,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 2) = 0;
  *(undefined8 *)
   ((long)&(this->m_GLProgPipelines).
           super__Vector_base<std::pair<__GLXcontextRec_*,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>_>,_std::allocator<std::pair<__GLXcontextRec_*,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 2) = 0;
  this->m_ShaderTypes = (SHADER_TYPE *)0x0;
  this->m_BaseBindings = (TBindings *)0x0;
  (this->m_Builder)._M_t.
  super___uniq_ptr_impl<Diligent::PipelineStateGLImpl::PipelineBuilderBase,_std::default_delete<Diligent::PipelineStateGLImpl::PipelineBuilderBase>_>
  ._M_t.
  super__Tuple_impl<0UL,_Diligent::PipelineStateGLImpl::PipelineBuilderBase_*,_std::default_delete<Diligent::PipelineStateGLImpl::PipelineBuilderBase>_>
  .super__Head_base<0UL,_Diligent::PipelineStateGLImpl::PipelineBuilderBase_*,_false>._M_head_impl =
       (PipelineBuilderBase *)0x0;
  (this->m_ShaderResources).
  super__Vector_base<std::shared_ptr<const_Diligent::ShaderResourcesGL>,_std::allocator<std::shared_ptr<const_Diligent::ShaderResourcesGL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_ShaderResources).
  super__Vector_base<std::shared_ptr<const_Diligent::ShaderResourcesGL>,_std::allocator<std::shared_ptr<const_Diligent::ShaderResourcesGL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_ShaderResources).
  super__Vector_base<std::shared_ptr<const_Diligent::ShaderResourcesGL>,_std::allocator<std::shared_ptr<const_Diligent::ShaderResourcesGL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_ShaderNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_ShaderNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_ShaderNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_ResourceAttibutions).
  super__Vector_base<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution,_std::allocator<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_ResourceAttibutions).
  super__Vector_base<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution,_std::allocator<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_ResourceAttibutions).
  super__Vector_base<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution,_std::allocator<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (ShaderGLImpl **)0x0;
  local_f8.super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  PipelineStateBase<Diligent::EngineGLImplTraits>::
  ExtractShaders<Diligent::ShaderGLImpl,Diligent::GraphicsPipelineStateCreateInfo,std::vector<Diligent::ShaderGLImpl*,std::allocator<Diligent::ShaderGLImpl*>>>
            (&this->super_PipelineStateBase<Diligent::EngineGLImplTraits>,CreateInfo,&local_f8,false
            );
  local_100.m_pObject = (ShaderGLImpl *)0x0;
  if (CreateInfo->pPS == (IShader *)0x0) {
    local_c8._24_8_ = (void *)0x0;
    local_c8._0_8_ = (pointer)0x0;
    local_c8._8_8_ = (IShaderSourceInputStreamFactory *)0x0;
    local_a8.SourceLength = 0;
    local_a0 = "main";
    local_98 = (ShaderMacro *)0x0;
    local_90 = 0;
    local_7c = false;
    local_78 = "_sampler";
    SStack_68.Major = 0;
    SStack_68.Minor = 0;
    local_60.Major = 0;
    local_60.Minor = 0;
    SStack_58._0_5_ = 0;
    SStack_58.Minor._1_3_ = 0;
    auStack_50._0_5_ = 0;
    auStack_50._5_8_ = 0;
    local_40 = (char *)0x0;
    pcStack_38 = (char *)0x0;
    local_70._0_4_ = SHADER_SOURCE_LANGUAGE_GLSL;
    local_70._4_4_ = SHADER_COMPILER_DEFAULT;
    local_c8._16_8_ = "void main(){}";
    local_80 = SHADER_TYPE_PIXEL;
    local_88 = "Dummy fragment shader";
    local_d8.m_pObject = (ShaderGLImpl *)0x0;
    local_d0 = &local_100;
    RenderDeviceGLImpl::CreateShader
              (pDeviceGL,(ShaderCreateInfo *)local_c8,(IShader **)&local_d8,(IDataBlob **)0x0);
    pRVar3 = local_d0;
    RVar2.m_pObject = local_d8.m_pObject;
    if ((local_d0 != (RefCntAutoPtr<Diligent::ShaderGLImpl> *)0x0) &&
       (local_d0->m_pObject != local_d8.m_pObject)) {
      RefCntAutoPtr<Diligent::ShaderGLImpl>::Release(local_d0);
      pRVar3->m_pObject = RVar2.m_pObject;
    }
    if (local_f8.
        super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_f8.
        super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<Diligent::ShaderGLImpl*,std::allocator<Diligent::ShaderGLImpl*>>::
      _M_realloc_insert<Diligent::RefCntAutoPtr<Diligent::ShaderGLImpl>&>
                ((vector<Diligent::ShaderGLImpl*,std::allocator<Diligent::ShaderGLImpl*>> *)
                 &local_f8,
                 (iterator)
                 local_f8.
                 super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish,&local_100);
    }
    else {
      *local_f8.
       super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>.
       _M_impl.super__Vector_impl_data._M_finish = local_100.m_pObject;
      local_f8.
      super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_f8.
           super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  this_00 = (PipelineBuilder<Diligent::GraphicsPipelineStateCreateInfo,_Diligent::GraphicsPipelineStateCreateInfoX>
             *)operator_new(0x2e8);
  Shaders_00 = (TShaderStages *)local_c8;
  local_c8._0_8_ =
       local_f8.
       super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_c8._8_8_ =
       local_f8.
       super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_c8._16_8_ =
       local_f8.
       super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_f8.super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  PipelineBuilder<Diligent::GraphicsPipelineStateCreateInfo,_Diligent::GraphicsPipelineStateCreateInfoX>
  ::PipelineBuilder(this_00,this,CreateInfo,Shaders_00);
  if ((pointer)local_c8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_c8._0_8_,local_c8._16_8_ - local_c8._0_8_);
  }
  pPVar1 = (this->m_Builder)._M_t.
           super___uniq_ptr_impl<Diligent::PipelineStateGLImpl::PipelineBuilderBase,_std::default_delete<Diligent::PipelineStateGLImpl::PipelineBuilderBase>_>
           ._M_t.
           super__Tuple_impl<0UL,_Diligent::PipelineStateGLImpl::PipelineBuilderBase_*,_std::default_delete<Diligent::PipelineStateGLImpl::PipelineBuilderBase>_>
           .super__Head_base<0UL,_Diligent::PipelineStateGLImpl::PipelineBuilderBase_*,_false>.
           _M_head_impl;
  (this->m_Builder)._M_t.
  super___uniq_ptr_impl<Diligent::PipelineStateGLImpl::PipelineBuilderBase,_std::default_delete<Diligent::PipelineStateGLImpl::PipelineBuilderBase>_>
  ._M_t.
  super__Tuple_impl<0UL,_Diligent::PipelineStateGLImpl::PipelineBuilderBase_*,_std::default_delete<Diligent::PipelineStateGLImpl::PipelineBuilderBase>_>
  .super__Head_base<0UL,_Diligent::PipelineStateGLImpl::PipelineBuilderBase_*,_false>._M_head_impl =
       (PipelineBuilderBase *)this_00;
  if (pPVar1 != (PipelineBuilderBase *)0x0) {
    (*pPVar1->_vptr_PipelineBuilderBase[1])();
  }
  PVar4 = GetStatus(this,((CreateInfo->super_PipelineStateCreateInfo).Flags &
                         PSO_CREATE_FLAG_ASYNCHRONOUS) == PSO_CREATE_FLAG_NONE);
  if ((PVar4 != PIPELINE_STATE_STATUS_READY) &&
     (((CreateInfo->super_PipelineStateCreateInfo).Flags & PSO_CREATE_FLAG_ASYNCHRONOUS) ==
      PSO_CREATE_FLAG_NONE)) {
    FormatString<char[26],char[96]>
              ((string *)local_c8,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "Status == PIPELINE_STATE_STATUS_READY || (CreateInfo.Flags & PSO_CREATE_FLAG_ASYNCHRONOUS) != 0"
               ,(char (*) [96])Shaders_00);
    DebugAssertionFailed
              ((Char *)local_c8._0_8_,"PipelineStateGLImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
               ,0x20a);
    if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
      operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
    }
  }
  RefCntAutoPtr<Diligent::ShaderGLImpl>::Release(&local_100);
  if (local_f8.
      super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.
                    super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.
                          super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.
                          super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

PipelineStateGLImpl::PipelineStateGLImpl(IReferenceCounters*                    pRefCounters,
                                         RenderDeviceGLImpl*                    pDeviceGL,
                                         const GraphicsPipelineStateCreateInfo& CreateInfo,
                                         bool                                   bIsDeviceInternal) :
    // clang-format off
    TPipelineStateBase
    {
        pRefCounters,
        pDeviceGL,
        CreateInfo,
        bIsDeviceInternal
    }
// clang-format on
{
    try
    {
        TShaderStages Shaders;
        ExtractShaders<ShaderGLImpl>(CreateInfo, Shaders);

        RefCntAutoPtr<ShaderGLImpl> pTempPS;
        if (CreateInfo.pPS == nullptr)
        {
            // Some OpenGL implementations fail if fragment shader is not present, so
            // create a dummy one.
            ShaderCreateInfo ShaderCI;
            ShaderCI.SourceLanguage  = SHADER_SOURCE_LANGUAGE_GLSL;
            ShaderCI.Source          = "void main(){}";
            ShaderCI.Desc.ShaderType = SHADER_TYPE_PIXEL;
            ShaderCI.Desc.Name       = "Dummy fragment shader";
            pDeviceGL->CreateShader(ShaderCI, pTempPS.DblPtr<IShader>(), nullptr);

            Shaders.emplace_back(pTempPS);
        }

        m_Builder = std::make_unique<PipelineBuilder<GraphicsPipelineStateCreateInfo, GraphicsPipelineStateCreateInfoX>>(*this, CreateInfo, std::move(Shaders));

        // Force builder tick
        PIPELINE_STATE_STATUS Status = GetStatus(/*WaitForCompletion = */ (CreateInfo.Flags & PSO_CREATE_FLAG_ASYNCHRONOUS) == 0);
        VERIFY_EXPR(Status == PIPELINE_STATE_STATUS_READY || (CreateInfo.Flags & PSO_CREATE_FLAG_ASYNCHRONOUS) != 0);
    }
    catch (...)
    {
        Destruct();
        throw;
    }
}